

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

Abc_Nam_t * Abc_NamStart(int nObjs,int nAveSize)

{
  uint uVar1;
  Abc_Nam_t *pAVar2;
  char *pcVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  uVar7 = 0x10;
  if (nObjs != 0) {
    uVar7 = nObjs;
  }
  pAVar2 = (Abc_Nam_t *)calloc(1,0x50);
  iVar8 = (nAveSize + 1) * uVar7;
  uVar5 = iVar8 + 0x10;
  uVar1 = iVar8 + 0x13;
  if (-1 < (int)uVar5) {
    uVar1 = uVar5;
  }
  pAVar2->nStore = uVar1 & 0xfffffffc;
  pcVar3 = (char *)malloc((long)(int)(uVar1 & 0xfffffffc));
  pAVar2->pStore = pcVar3;
  uVar5 = uVar7 - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar1 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar1 != 0);
    if (uVar6 < 9) break;
    iVar8 = 5;
    while (uVar6 % (iVar8 - 2U) != 0) {
      uVar1 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar6 < uVar1) goto LAB_001cd375;
    }
  }
LAB_001cd375:
  pAVar2->nBins = uVar6;
  piVar4 = (int *)calloc((long)(int)uVar6,4);
  pAVar2->pBins = piVar4;
  if (0 < (int)uVar7) {
    piVar4 = (int *)malloc((ulong)uVar7 << 2);
    (pAVar2->vInt2Handle).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_001cd423;
    (pAVar2->vInt2Handle).nCap = uVar7;
  }
  Vec_IntPush(&pAVar2->vInt2Handle,-1);
  if ((pAVar2->vInt2Next).nCap < (int)uVar7) {
    piVar4 = (pAVar2->vInt2Next).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar7 << 2);
    }
    (pAVar2->vInt2Next).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_001cd423:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pAVar2->vInt2Next).nCap = uVar7;
  }
  Vec_IntPush(&pAVar2->vInt2Next,-1);
  pAVar2->iHandle = 4;
  pcVar3 = pAVar2->pStore;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pAVar2->nRefs = 1;
  return pAVar2;
}

Assistant:

Abc_Nam_t * Abc_NamStart( int nObjs, int nAveSize )
{
    Abc_Nam_t * p;
    if ( nObjs == 0 )
        nObjs = 16;
    p = ABC_CALLOC( Abc_Nam_t, 1 );
    p->nStore      = ((nObjs * (nAveSize + 1) + 16) / 4) * 4;
    p->pStore      = ABC_ALLOC( char, p->nStore );
    p->nBins       = Abc_PrimeCudd( nObjs );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    // 0th object is unused
    Vec_IntGrow( &p->vInt2Handle, nObjs );  Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntGrow( &p->vInt2Next,   nObjs );  Vec_IntPush( &p->vInt2Next,   -1 );
    p->iHandle     = 4;
    memset( p->pStore, 0, 4 );
//Abc_Print( 1, "Starting nam with %d bins.\n", p->nBins );
    // start reference counting
    p->nRefs       = 1;
    return p;
}